

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  huff_tables *phVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint num_bits;
  ulong uVar8;
  
  pcVar3 = pD->m_dc_coeffs[component_id];
  phVar4 = pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]];
  num_bits = phVar4->look_up[pD->m_bit_buf >> 0x18];
  uVar8 = (ulong)(int)num_bits;
  if ((long)uVar8 < 0) {
    uVar7 = 0xfffffff8;
    do {
      uVar7 = uVar7 - 1;
      num_bits = phVar4->tree[-(uint)((pD->m_bit_buf >> (uVar7 & 0x1f) & 1) != 0) - (int)uVar8];
      uVar8 = (ulong)num_bits;
    } while ((int)num_bits < 0);
    uVar7 = -uVar7;
  }
  else {
    uVar7 = (uint)phVar4->code_size[uVar8];
  }
  puVar5 = pcVar3->pData;
  iVar1 = pcVar3->block_size;
  iVar2 = pcVar3->block_num_x;
  get_bits_no_markers(pD,uVar7);
  if (num_bits == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = get_bits_no_markers(pD,num_bits);
    if ((int)uVar6 < *(int *)(s_extend_test + (ulong)(num_bits & 0xf) * 4)) {
      uVar6 = uVar6 + *(int *)(s_extend_offset + (ulong)(num_bits & 0xf) * 4);
    }
  }
  uVar6 = uVar6 + pD->m_last_dc_val[component_id];
  pD->m_last_dc_val[component_id] = uVar6;
  *(short *)(puVar5 + (long)(block_y * iVar1 * iVar2) + (long)(block_x * iVar1)) =
       (short)(uVar6 << ((byte)pD->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int s, r;
  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0) {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}